

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Instance *pIVar4;
  long lVar5;
  AffineSpace3ff *pAVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char cVar26;
  runtime_error *prVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  size_t i;
  ulong uVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined8 extraout_XMM1_Qa;
  float fVar38;
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar35 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar36 [16];
  uint uVar39;
  uint uVar45;
  uint uVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [12];
  float fVar49;
  undefined1 in_XMM4 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [12];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar82;
  float fVar83;
  undefined1 auVar77 [16];
  float fVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_189;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float local_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  anon_class_8_1_8991fb9c local_140;
  undefined8 local_138;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_130;
  anon_class_16_2_ed117de8_conflict24 local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  local_118;
  task_group_context local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar36 = _DAT_01feba00;
  uVar39 = current->_begin;
  uVar31 = (ulong)uVar39;
  uVar45 = current->_end;
  if (uVar45 - uVar39 < 0x400) {
    auVar32 = _DAT_01feb9f0;
    auVar40 = _DAT_01feba00;
    if (uVar39 < uVar45) {
      pIVar4 = this->calculateBounds->mesh;
      lVar28 = uVar45 - uVar31;
      do {
        if ((pIVar4->super_Geometry).field_8.field_0x1 == '\x01') {
          pAVar6 = pIVar4->local2world;
          fVar33 = (pAVar6->p).field_0.m128[3];
          local_16c = (pAVar6->l).vx.field_0.m128[3];
          fVar37 = (pAVar6->l).vy.field_0.m128[3];
          fVar38 = (pAVar6->l).vz.field_0.m128[3];
          aVar3 = (pAVar6->l).vx.field_0.field_1;
          local_158 = (pAVar6->l).vy.field_0.m128[0];
          fStack_154 = (pAVar6->l).vy.field_0.m128[1];
          fStack_150 = (pAVar6->l).vy.field_0.m128[2];
          fStack_14c = (pAVar6->l).vy.field_0.m128[3];
          auVar34._8_4_ = fStack_150;
          auVar34._0_8_ = aVar3._4_8_;
          auVar34._12_4_ = 0;
          fVar47 = local_16c * fVar37 + fVar33 * fVar38;
          fVar100 = local_16c * fVar37 - fVar33 * fVar38;
          fVar49 = fVar33 * fVar33 + local_16c * local_16c + -fVar37 * fVar37 + -fVar38 * fVar38;
          fVar61 = fVar33 * fVar33 - local_16c * local_16c;
          fVar68 = fVar37 * fVar37 + fVar61 + -fVar38 * fVar38;
          fVar102 = local_16c * fVar38 - fVar33 * fVar37;
          fVar101 = fVar33 * fVar37 + local_16c * fVar38;
          fVar103 = fVar37 * fVar38 + fVar33 * local_16c;
          fVar69 = fVar37 * fVar38 - fVar33 * local_16c;
          fVar97 = fVar38 * fVar38 + fVar61 + -fVar37 * fVar37;
          fVar33 = (pAVar6->l).vz.field_0.m128[0];
          fVar37 = (pAVar6->l).vz.field_0.m128[1];
          fVar38 = (pAVar6->l).vz.field_0.m128[2];
          fVar47 = fVar47 + fVar47;
          fVar102 = fVar102 + fVar102;
          fVar61 = (pAVar6->p).field_0.m128[0];
          fVar96 = (pAVar6->p).field_0.m128[1];
          fVar99 = (pAVar6->p).field_0.m128[2];
          fVar100 = fVar100 + fVar100;
          fVar103 = fVar103 + fVar103;
          fVar101 = fVar101 + fVar101;
          fVar69 = fVar69 + fVar69;
          fVar70 = fVar49 * 1.0 + fVar47 * 0.0 + fVar102 * 0.0;
          fVar95 = fVar49 * 0.0 + fVar47 * 1.0 + fVar102 * 0.0;
          fVar98 = fVar49 * 0.0 + fVar47 * 0.0 + fVar102 * 1.0;
          fVar60 = fVar49 * 0.0 + fVar47 * 0.0 + fVar102 * 0.0;
          fVar47 = fVar100 * 1.0 + fVar68 * 0.0 + fVar103 * 0.0;
          fVar49 = fVar100 * 0.0 + fVar68 * 1.0 + fVar103 * 0.0;
          fVar65 = fVar100 * 0.0 + fVar68 * 0.0 + fVar103 * 1.0;
          fVar68 = fVar100 * 0.0 + fVar68 * 0.0 + fVar103 * 0.0;
          fVar58 = fVar101 * 1.0 + fVar69 * 0.0 + fVar97 * 0.0;
          fVar76 = fVar101 * 0.0 + fVar69 * 1.0 + fVar97 * 0.0;
          fVar90 = fVar101 * 0.0 + fVar69 * 0.0 + fVar97 * 1.0;
          fVar82 = fVar101 * 0.0 + fVar69 * 0.0 + fVar97 * 0.0;
          local_188._0_4_ = aVar3.x;
          local_188._4_4_ = local_188._0_4_;
          fStack_180 = (float)local_188._0_4_;
          fStack_17c = (float)local_188._0_4_;
          fVar102 = (float)local_188._0_4_ * fVar70 + fVar47 * 0.0 + fVar58 * 0.0;
          fVar97 = (float)local_188._0_4_ * fVar95 + fVar49 * 0.0 + fVar76 * 0.0;
          fVar100 = (float)local_188._0_4_ * fVar98 + fVar65 * 0.0 + fVar90 * 0.0;
          fVar103 = (float)local_188._0_4_ * fVar60 + fVar68 * 0.0 + fVar82 * 0.0;
          lVar5 = *(long *)&(pIVar4->super_Geometry).field_0x58;
          local_168._0_4_ = aVar3.y;
          local_168._4_4_ = aVar3.z;
          fVar101 = local_158 * fVar70 + fStack_154 * fVar47 + fVar58 * 0.0;
          fVar57 = local_158 * fVar95 + fStack_154 * fVar49 + fVar76 * 0.0;
          fVar59 = local_158 * fVar98 + fStack_154 * fVar65 + fVar90 * 0.0;
          fVar88 = local_158 * fVar60 + fStack_154 * fVar68 + fVar82 * 0.0;
          fVar91 = fVar33 * fVar70 + fVar37 * fVar47 + fVar38 * fVar58;
          fVar92 = fVar33 * fVar95 + fVar37 * fVar49 + fVar38 * fVar76;
          fVar93 = fVar33 * fVar98 + fVar37 * fVar65 + fVar38 * fVar90;
          fVar94 = fVar33 * fVar60 + fVar37 * fVar68 + fVar38 * fVar82;
          fVar69 = fVar61 * fVar70 + fVar96 * fVar47 + fVar99 * fVar58 +
                   (float)local_168._0_4_ + 0.0;
          fVar70 = fVar61 * fVar95 + fVar96 * fVar49 + fVar99 * fVar76 +
                   (float)local_168._4_4_ + 0.0;
          fVar58 = fVar61 * fVar98 + fVar96 * fVar65 + fVar99 * fVar90 + fStack_150 + 0.0;
          fVar68 = fVar61 * fVar60 + fVar96 * fVar68 + fVar99 * fVar82 + 0.0;
          auVar77 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30))
          ;
          auVar73 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40))
          ;
          fVar61 = auVar77._0_4_;
          fVar76 = auVar77._4_4_;
          fVar33 = auVar77._8_4_;
          fVar60 = fVar33 * fVar91 + fVar69;
          fVar90 = fVar33 * fVar92 + fVar70;
          fVar82 = fVar33 * fVar93 + fVar58;
          fVar83 = fVar33 * fVar94 + fVar68;
          fVar84 = fVar76 * fVar101;
          fVar85 = fVar76 * fVar57;
          fVar86 = fVar76 * fVar59;
          fVar76 = fVar76 * fVar88;
          fVar96 = fVar84 + fVar60;
          fVar99 = fVar85 + fVar90;
          fVar47 = fVar86 + fVar82;
          fVar49 = fVar76 + fVar83;
          fVar33 = fVar61 * fVar102;
          fVar37 = fVar61 * fVar97;
          fVar38 = fVar61 * fVar100;
          fVar61 = fVar61 * fVar103;
          auVar51._0_4_ = fVar33 + fVar96;
          auVar51._4_4_ = fVar37 + fVar99;
          auVar51._8_4_ = fVar38 + fVar47;
          auVar51._12_4_ = fVar61 + fVar49;
          auVar77 = minps(_DAT_01feb9f0,auVar51);
          auVar74 = maxps(_DAT_01feba00,auVar51);
          fVar95 = auVar73._0_4_;
          fVar98 = auVar73._4_4_;
          fVar65 = auVar73._8_4_;
          in_XMM4._0_4_ = fVar65 * fVar91 + fVar69;
          in_XMM4._4_4_ = fVar65 * fVar92 + fVar70;
          in_XMM4._8_4_ = fVar65 * fVar93 + fVar58;
          in_XMM4._12_4_ = fVar65 * fVar94 + fVar68;
          fVar84 = fVar84 + in_XMM4._0_4_;
          fVar85 = fVar85 + in_XMM4._4_4_;
          fVar86 = fVar86 + in_XMM4._8_4_;
          fVar76 = fVar76 + in_XMM4._12_4_;
          fVar65 = fVar33 + fVar84;
          fVar68 = fVar37 + fVar85;
          fVar69 = fVar38 + fVar86;
          fVar70 = fVar61 + fVar76;
          auVar75._4_4_ = fVar68;
          auVar75._0_4_ = fVar65;
          auVar75._8_4_ = fVar69;
          auVar75._12_4_ = fVar70;
          auVar77 = minps(auVar77,auVar75);
          auVar10._4_4_ = fVar68;
          auVar10._0_4_ = fVar65;
          auVar10._8_4_ = fVar69;
          auVar10._12_4_ = fVar70;
          auVar75 = maxps(auVar74,auVar10);
          fVar101 = fVar98 * fVar101;
          fVar57 = fVar98 * fVar57;
          fVar59 = fVar98 * fVar59;
          fVar98 = fVar98 * fVar88;
          fVar60 = fVar60 + fVar101;
          fVar90 = fVar90 + fVar57;
          fVar82 = fVar82 + fVar59;
          fVar83 = fVar83 + fVar98;
          fVar65 = fVar33 + fVar60;
          fVar68 = fVar37 + fVar90;
          fVar69 = fVar38 + fVar82;
          fVar70 = fVar61 + fVar83;
          auVar74._4_4_ = fVar68;
          auVar74._0_4_ = fVar65;
          auVar74._8_4_ = fVar69;
          auVar74._12_4_ = fVar70;
          auVar73 = minps(auVar77,auVar74);
          auVar11._4_4_ = fVar68;
          auVar11._0_4_ = fVar65;
          auVar11._8_4_ = fVar69;
          auVar11._12_4_ = fVar70;
          auVar75 = maxps(auVar75,auVar11);
          fVar101 = fVar101 + in_XMM4._0_4_;
          fVar57 = fVar57 + in_XMM4._4_4_;
          fVar59 = fVar59 + in_XMM4._8_4_;
          fVar98 = fVar98 + in_XMM4._12_4_;
          fVar33 = fVar33 + fVar101;
          fVar37 = fVar37 + fVar57;
          fVar38 = fVar38 + fVar59;
          fVar61 = fVar61 + fVar98;
          auVar77._4_4_ = fVar37;
          auVar77._0_4_ = fVar33;
          auVar77._8_4_ = fVar38;
          auVar77._12_4_ = fVar61;
          auVar77 = minps(auVar73,auVar77);
          auVar73._4_4_ = fVar37;
          auVar73._0_4_ = fVar33;
          auVar73._8_4_ = fVar38;
          auVar73._12_4_ = fVar61;
          auVar73 = maxps(auVar75,auVar73);
          fVar102 = fVar95 * fVar102;
          fVar97 = fVar95 * fVar97;
          fVar100 = fVar95 * fVar100;
          fVar95 = fVar95 * fVar103;
          auVar62._0_4_ = fVar96 + fVar102;
          auVar62._4_4_ = fVar99 + fVar97;
          auVar62._8_4_ = fVar47 + fVar100;
          auVar62._12_4_ = fVar49 + fVar95;
          auVar77 = minps(auVar77,auVar62);
          auVar73 = maxps(auVar73,auVar62);
          fVar84 = fVar84 + fVar102;
          fVar85 = fVar85 + fVar97;
          fVar86 = fVar86 + fVar100;
          fVar76 = fVar76 + fVar95;
          auVar18._4_4_ = fVar85;
          auVar18._0_4_ = fVar84;
          auVar18._8_4_ = fVar86;
          auVar18._12_4_ = fVar76;
          auVar77 = minps(auVar77,auVar18);
          auVar19._4_4_ = fVar85;
          auVar19._0_4_ = fVar84;
          auVar19._8_4_ = fVar86;
          auVar19._12_4_ = fVar76;
          auVar73 = maxps(auVar73,auVar19);
          auVar79._0_4_ = fVar60 + fVar102;
          auVar79._4_4_ = fVar90 + fVar97;
          auVar79._8_4_ = fVar82 + fVar100;
          auVar79._12_4_ = fVar83 + fVar95;
          auVar77 = minps(auVar77,auVar79);
          auVar73 = maxps(auVar73,auVar79);
          auVar66._0_4_ = fVar102 + fVar101;
          auVar66._4_4_ = fVar97 + fVar57;
          auVar66._8_4_ = fVar100 + fVar59;
          auVar66._12_4_ = fVar95 + fVar98;
          auVar77 = minps(auVar77,auVar66);
          auVar73 = maxps(auVar73,auVar66);
          _local_168 = auVar34;
        }
        else {
          lVar5 = *(long *)&(pIVar4->super_Geometry).field_0x58;
          pAVar6 = pIVar4->local2world;
          fVar33 = (pAVar6->l).vx.field_0.m128[0];
          fVar37 = (pAVar6->l).vx.field_0.m128[1];
          fVar38 = (pAVar6->l).vx.field_0.m128[2];
          fVar61 = (pAVar6->l).vx.field_0.m128[3];
          fVar96 = (pAVar6->l).vy.field_0.m128[0];
          fVar99 = (pAVar6->l).vy.field_0.m128[1];
          fVar102 = (pAVar6->l).vy.field_0.m128[2];
          fVar97 = (pAVar6->l).vy.field_0.m128[3];
          fVar100 = (pAVar6->l).vz.field_0.m128[0];
          fVar103 = (pAVar6->l).vz.field_0.m128[1];
          fVar47 = (pAVar6->l).vz.field_0.m128[2];
          fVar49 = (pAVar6->l).vz.field_0.m128[3];
          fVar65 = (pAVar6->p).field_0.m128[0];
          fVar68 = (pAVar6->p).field_0.m128[1];
          fVar69 = (pAVar6->p).field_0.m128[2];
          fVar70 = (pAVar6->p).field_0.m128[3];
          auVar77 = minps(*(undefined1 (*) [16])(lVar5 + 0x10),*(undefined1 (*) [16])(lVar5 + 0x30))
          ;
          auVar34 = maxps(*(undefined1 (*) [16])(lVar5 + 0x20),*(undefined1 (*) [16])(lVar5 + 0x40))
          ;
          fVar60 = auVar77._0_4_;
          fVar90 = auVar77._4_4_;
          fVar95 = auVar77._8_4_;
          fVar76 = fVar95 * fVar100 + fVar65;
          fVar82 = fVar95 * fVar103 + fVar68;
          fVar83 = fVar95 * fVar47 + fVar69;
          fVar84 = fVar95 * fVar49 + fVar70;
          fVar85 = fVar90 * fVar96;
          fVar86 = fVar90 * fVar99;
          fVar88 = fVar90 * fVar102;
          fVar90 = fVar90 * fVar97;
          fVar91 = fVar85 + fVar76;
          fVar92 = fVar86 + fVar82;
          fVar93 = fVar88 + fVar83;
          fVar94 = fVar90 + fVar84;
          fVar57 = fVar60 * fVar33;
          fVar58 = fVar60 * fVar37;
          fVar59 = fVar60 * fVar38;
          fVar60 = fVar60 * fVar61;
          fVar95 = fVar57 + fVar91;
          fVar98 = fVar58 + fVar92;
          fVar101 = fVar59 + fVar93;
          fVar105 = fVar60 + fVar94;
          auVar22._4_4_ = fVar98;
          auVar22._0_4_ = fVar95;
          auVar22._8_4_ = fVar101;
          auVar22._12_4_ = fVar105;
          auVar77 = minps(_DAT_01feb9f0,auVar22);
          auVar23._4_4_ = fVar98;
          auVar23._0_4_ = fVar95;
          auVar23._8_4_ = fVar101;
          auVar23._12_4_ = fVar105;
          auVar73 = maxps(_DAT_01feba00,auVar23);
          fVar95 = auVar34._0_4_;
          fVar98 = auVar34._4_4_;
          fVar101 = auVar34._8_4_;
          fVar65 = fVar101 * fVar100 + fVar65;
          fVar68 = fVar101 * fVar103 + fVar68;
          fVar69 = fVar101 * fVar47 + fVar69;
          fVar70 = fVar101 * fVar49 + fVar70;
          fVar85 = fVar85 + fVar65;
          fVar86 = fVar86 + fVar68;
          fVar88 = fVar88 + fVar69;
          fVar90 = fVar90 + fVar70;
          auVar50._0_4_ = fVar57 + fVar85;
          auVar50._4_4_ = fVar58 + fVar86;
          auVar50._8_4_ = fVar59 + fVar88;
          auVar50._12_4_ = fVar60 + fVar90;
          auVar34 = minps(auVar77,auVar50);
          auVar77 = maxps(auVar73,auVar50);
          fVar96 = fVar98 * fVar96;
          fVar99 = fVar98 * fVar99;
          fVar102 = fVar98 * fVar102;
          fVar98 = fVar98 * fVar97;
          fVar76 = fVar76 + fVar96;
          fVar82 = fVar82 + fVar99;
          fVar83 = fVar83 + fVar102;
          fVar84 = fVar84 + fVar98;
          in_XMM4._0_4_ = fVar57 + fVar76;
          in_XMM4._4_4_ = fVar58 + fVar82;
          in_XMM4._8_4_ = fVar59 + fVar83;
          in_XMM4._12_4_ = fVar60 + fVar84;
          auVar34 = minps(auVar34,in_XMM4);
          auVar77 = maxps(auVar77,in_XMM4);
          fVar96 = fVar96 + fVar65;
          fVar99 = fVar99 + fVar68;
          fVar102 = fVar102 + fVar69;
          fVar98 = fVar98 + fVar70;
          fVar57 = fVar57 + fVar96;
          fVar58 = fVar58 + fVar99;
          fVar59 = fVar59 + fVar102;
          fVar60 = fVar60 + fVar98;
          auVar7._4_4_ = fVar58;
          auVar7._0_4_ = fVar57;
          auVar7._8_4_ = fVar59;
          auVar7._12_4_ = fVar60;
          auVar34 = minps(auVar34,auVar7);
          auVar8._4_4_ = fVar58;
          auVar8._0_4_ = fVar57;
          auVar8._8_4_ = fVar59;
          auVar8._12_4_ = fVar60;
          auVar77 = maxps(auVar77,auVar8);
          fVar33 = fVar95 * fVar33;
          fVar37 = fVar95 * fVar37;
          fVar38 = fVar95 * fVar38;
          fVar95 = fVar95 * fVar61;
          fVar91 = fVar91 + fVar33;
          fVar92 = fVar92 + fVar37;
          fVar93 = fVar93 + fVar38;
          fVar94 = fVar94 + fVar95;
          auVar20._4_4_ = fVar92;
          auVar20._0_4_ = fVar91;
          auVar20._8_4_ = fVar93;
          auVar20._12_4_ = fVar94;
          auVar34 = minps(auVar34,auVar20);
          auVar21._4_4_ = fVar92;
          auVar21._0_4_ = fVar91;
          auVar21._8_4_ = fVar93;
          auVar21._12_4_ = fVar94;
          auVar77 = maxps(auVar77,auVar21);
          fVar85 = fVar85 + fVar33;
          fVar86 = fVar86 + fVar37;
          fVar88 = fVar88 + fVar38;
          fVar90 = fVar90 + fVar95;
          auVar12._4_4_ = fVar86;
          auVar12._0_4_ = fVar85;
          auVar12._8_4_ = fVar88;
          auVar12._12_4_ = fVar90;
          auVar34 = minps(auVar34,auVar12);
          auVar13._4_4_ = fVar86;
          auVar13._0_4_ = fVar85;
          auVar13._8_4_ = fVar88;
          auVar13._12_4_ = fVar90;
          auVar77 = maxps(auVar77,auVar13);
          auVar78._0_4_ = fVar76 + fVar33;
          auVar78._4_4_ = fVar82 + fVar37;
          auVar78._8_4_ = fVar83 + fVar38;
          auVar78._12_4_ = fVar84 + fVar95;
          auVar34 = minps(auVar34,auVar78);
          auVar73 = maxps(auVar77,auVar78);
          auVar35._0_4_ = fVar33 + fVar96;
          auVar35._4_4_ = fVar37 + fVar99;
          auVar35._8_4_ = fVar38 + fVar102;
          auVar35._12_4_ = fVar95 + fVar98;
          auVar77 = minps(auVar34,auVar35);
          auVar73 = maxps(auVar73,auVar35);
        }
        auVar54._0_4_ = auVar77._0_4_ + auVar73._0_4_;
        auVar54._4_4_ = auVar77._4_4_ + auVar73._4_4_;
        auVar54._8_4_ = auVar77._8_4_ + auVar73._8_4_;
        auVar54._12_4_ = auVar77._12_4_ + auVar73._12_4_;
        auVar32 = minps(auVar32,auVar54);
        auVar40 = maxps(auVar40,auVar54);
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
    }
    uVar29 = (ulong)current->_end;
    if (uVar39 < current->_end) {
      auVar41._0_4_ = auVar40._0_4_ - auVar32._0_4_;
      auVar41._4_4_ = auVar40._4_4_ - auVar32._4_4_;
      auVar41._8_4_ = auVar40._8_4_ - auVar32._8_4_;
      auVar41._12_4_ = auVar40._12_4_ - auVar32._12_4_;
      auVar40 = rcpps(in_XMM4,auVar41);
      fVar33 = auVar40._0_4_;
      fVar37 = auVar40._4_4_;
      fVar38 = auVar40._8_4_;
      do {
        pIVar4 = this->calculateBounds->mesh;
        pAVar6 = pIVar4->local2world;
        if ((pIVar4->super_Geometry).field_8.field_0x1 == '\x01') {
          fVar61 = (pAVar6->p).field_0.m128[3];
          fVar96 = (pAVar6->l).vx.field_0.m128[3];
          fVar99 = (pAVar6->l).vy.field_0.m128[3];
          fVar102 = (pAVar6->l).vz.field_0.m128[3];
          aVar3 = (pAVar6->l).vx.field_0.field_1;
          local_158 = (pAVar6->l).vy.field_0.m128[0];
          fStack_154 = (pAVar6->l).vy.field_0.m128[1];
          fStack_150 = (pAVar6->l).vy.field_0.m128[2];
          fStack_14c = (pAVar6->l).vy.field_0.m128[3];
          auVar64._0_8_ = aVar3._4_8_;
          auVar64._8_4_ = fStack_150;
          auVar64._12_4_ = 0;
          fVar68 = fVar96 * fVar99 + fVar61 * fVar102;
          fVar49 = fVar96 * fVar99 - fVar61 * fVar102;
          fVar69 = fVar61 * fVar61 + fVar96 * fVar96 + -fVar99 * fVar99 + -fVar102 * fVar102;
          fVar97 = fVar61 * fVar61 - fVar96 * fVar96;
          fVar95 = fVar99 * fVar99 + fVar97 + -fVar102 * fVar102;
          fVar65 = fVar96 * fVar102 - fVar61 * fVar99;
          fVar101 = fVar61 * fVar99 + fVar96 * fVar102;
          fVar70 = fVar99 * fVar102 + fVar61 * fVar96;
          fVar103 = fVar99 * fVar102 - fVar61 * fVar96;
          fVar47 = fVar102 * fVar102 + fVar97 + -fVar99 * fVar99;
          fVar61 = (pAVar6->l).vz.field_0.m128[0];
          fVar96 = (pAVar6->l).vz.field_0.m128[1];
          fVar99 = (pAVar6->l).vz.field_0.m128[2];
          fVar68 = fVar68 + fVar68;
          fVar65 = fVar65 + fVar65;
          fVar102 = (pAVar6->p).field_0.m128[0];
          fVar97 = (pAVar6->p).field_0.m128[1];
          fVar100 = (pAVar6->p).field_0.m128[2];
          fVar49 = fVar49 + fVar49;
          fVar70 = fVar70 + fVar70;
          fVar101 = fVar101 + fVar101;
          fVar103 = fVar103 + fVar103;
          fVar98 = fVar69 * 1.0 + fVar68 * 0.0 + fVar65 * 0.0;
          fVar57 = fVar69 * 0.0 + fVar68 * 1.0 + fVar65 * 0.0;
          fVar59 = fVar69 * 0.0 + fVar68 * 0.0 + fVar65 * 1.0;
          fVar60 = fVar69 * 0.0 + fVar68 * 0.0 + fVar65 * 0.0;
          fVar65 = fVar49 * 1.0 + fVar95 * 0.0 + fVar70 * 0.0;
          fVar68 = fVar49 * 0.0 + fVar95 * 1.0 + fVar70 * 0.0;
          fVar69 = fVar49 * 0.0 + fVar95 * 0.0 + fVar70 * 1.0;
          fVar49 = fVar49 * 0.0 + fVar95 * 0.0 + fVar70 * 0.0;
          fVar70 = fVar101 * 1.0 + fVar103 * 0.0 + fVar47 * 0.0;
          fVar84 = fVar101 * 0.0 + fVar103 * 1.0 + fVar47 * 0.0;
          fVar85 = fVar101 * 0.0 + fVar103 * 0.0 + fVar47 * 1.0;
          fVar103 = fVar101 * 0.0 + fVar103 * 0.0 + fVar47 * 0.0;
          local_188._0_4_ = aVar3.x;
          local_188._4_4_ = local_188._0_4_;
          fStack_180 = (float)local_188._0_4_;
          fStack_17c = (float)local_188._0_4_;
          fVar76 = (float)local_188._0_4_ * fVar98 + fVar65 * 0.0 + fVar70 * 0.0;
          fVar90 = (float)local_188._0_4_ * fVar57 + fVar68 * 0.0 + fVar84 * 0.0;
          fVar82 = (float)local_188._0_4_ * fVar59 + fVar69 * 0.0 + fVar85 * 0.0;
          fVar83 = (float)local_188._0_4_ * fVar60 + fVar49 * 0.0 + fVar103 * 0.0;
          local_168._0_4_ = aVar3.y;
          local_168._4_4_ = aVar3.z;
          fVar95 = local_158 * fVar98 + fStack_154 * fVar65 + fVar70 * 0.0;
          fVar101 = local_158 * fVar57 + fStack_154 * fVar68 + fVar84 * 0.0;
          fVar58 = local_158 * fVar59 + fStack_154 * fVar69 + fVar85 * 0.0;
          fVar87 = local_158 * fVar60 + fStack_154 * fVar49 + fVar103 * 0.0;
          fVar89 = fVar61 * fVar98 + fVar96 * fVar65 + fVar99 * fVar70;
          fVar106 = fVar61 * fVar57 + fVar96 * fVar68 + fVar99 * fVar84;
          fVar104 = fVar61 * fVar59 + fVar96 * fVar69 + fVar99 * fVar85;
          fVar107 = fVar61 * fVar60 + fVar96 * fVar49 + fVar99 * fVar103;
          fVar61 = fVar102 * fVar98 + fVar97 * fVar65 + fVar100 * fVar70 +
                   (float)local_168._0_4_ + 0.0;
          fVar96 = fVar102 * fVar57 + fVar97 * fVar68 + fVar100 * fVar84 +
                   (float)local_168._4_4_ + 0.0;
          fVar99 = fVar102 * fVar59 + fVar97 * fVar69 + fVar100 * fVar85 + fStack_150 + 0.0;
          fVar102 = fVar102 * fVar60 + fVar97 * fVar49 + fVar100 * fVar103 + 0.0;
          lVar28 = *(long *)&(pIVar4->super_Geometry).field_0x58;
          auVar34 = minps(*(undefined1 (*) [16])(lVar28 + 0x10),
                          *(undefined1 (*) [16])(lVar28 + 0x30));
          auVar40 = maxps(*(undefined1 (*) [16])(lVar28 + 0x20),
                          *(undefined1 (*) [16])(lVar28 + 0x40));
          fVar47 = auVar34._0_4_;
          fVar86 = auVar34._4_4_;
          fVar97 = auVar34._8_4_;
          fVar85 = fVar97 * fVar89 + fVar61;
          fVar88 = fVar97 * fVar106 + fVar96;
          fVar91 = fVar97 * fVar104 + fVar99;
          fVar92 = fVar97 * fVar107 + fVar102;
          fVar93 = fVar86 * fVar95;
          fVar94 = fVar86 * fVar101;
          fVar105 = fVar86 * fVar58;
          fVar86 = fVar86 * fVar87;
          fVar49 = fVar93 + fVar85;
          fVar65 = fVar94 + fVar88;
          fVar68 = fVar105 + fVar91;
          fVar69 = fVar86 + fVar92;
          fVar97 = fVar47 * fVar76;
          fVar100 = fVar47 * fVar90;
          fVar103 = fVar47 * fVar82;
          fVar47 = fVar47 * fVar83;
          auVar44._0_4_ = fVar97 + fVar49;
          auVar44._4_4_ = fVar100 + fVar65;
          auVar44._8_4_ = fVar103 + fVar68;
          auVar44._12_4_ = fVar47 + fVar69;
          auVar77 = minps(_DAT_01feb9f0,auVar44);
          auVar34 = maxps(auVar36,auVar44);
          fVar84 = auVar40._0_4_;
          fVar60 = auVar40._4_4_;
          fVar70 = auVar40._8_4_;
          fVar61 = fVar70 * fVar89 + fVar61;
          fVar96 = fVar70 * fVar106 + fVar96;
          fVar99 = fVar70 * fVar104 + fVar99;
          fVar102 = fVar70 * fVar107 + fVar102;
          fVar93 = fVar93 + fVar61;
          fVar94 = fVar94 + fVar96;
          fVar105 = fVar105 + fVar99;
          fVar86 = fVar86 + fVar102;
          fVar70 = fVar97 + fVar93;
          fVar98 = fVar100 + fVar94;
          fVar57 = fVar103 + fVar105;
          fVar59 = fVar47 + fVar86;
          auVar40._4_4_ = fVar98;
          auVar40._0_4_ = fVar70;
          auVar40._8_4_ = fVar57;
          auVar40._12_4_ = fVar59;
          auVar77 = minps(auVar77,auVar40);
          auVar9._4_4_ = fVar98;
          auVar9._0_4_ = fVar70;
          auVar9._8_4_ = fVar57;
          auVar9._12_4_ = fVar59;
          auVar40 = maxps(auVar34,auVar9);
          fVar95 = fVar60 * fVar95;
          fVar101 = fVar60 * fVar101;
          fVar58 = fVar60 * fVar58;
          fVar60 = fVar60 * fVar87;
          fVar85 = fVar85 + fVar95;
          fVar88 = fVar88 + fVar101;
          fVar91 = fVar91 + fVar58;
          fVar92 = fVar92 + fVar60;
          auVar67._0_4_ = fVar97 + fVar85;
          auVar67._4_4_ = fVar100 + fVar88;
          auVar67._8_4_ = fVar103 + fVar91;
          auVar67._12_4_ = fVar47 + fVar92;
          auVar34 = minps(auVar77,auVar67);
          auVar40 = maxps(auVar40,auVar67);
          fVar95 = fVar95 + fVar61;
          fVar101 = fVar101 + fVar96;
          fVar58 = fVar58 + fVar99;
          fVar60 = fVar60 + fVar102;
          auVar53._0_4_ = fVar97 + fVar95;
          auVar53._4_4_ = fVar100 + fVar101;
          auVar53._8_4_ = fVar103 + fVar58;
          auVar53._12_4_ = fVar47 + fVar60;
          auVar34 = minps(auVar34,auVar53);
          auVar40 = maxps(auVar40,auVar53);
          fVar76 = fVar84 * fVar76;
          fVar90 = fVar84 * fVar90;
          fVar82 = fVar84 * fVar82;
          fVar84 = fVar84 * fVar83;
          auVar56._0_4_ = fVar49 + fVar76;
          auVar56._4_4_ = fVar65 + fVar90;
          auVar56._8_4_ = fVar68 + fVar82;
          auVar56._12_4_ = fVar69 + fVar84;
          auVar34 = minps(auVar34,auVar56);
          auVar40 = maxps(auVar40,auVar56);
          fVar93 = fVar93 + fVar76;
          fVar94 = fVar94 + fVar90;
          fVar105 = fVar105 + fVar82;
          fVar86 = fVar86 + fVar84;
          auVar16._4_4_ = fVar94;
          auVar16._0_4_ = fVar93;
          auVar16._8_4_ = fVar105;
          auVar16._12_4_ = fVar86;
          auVar34 = minps(auVar34,auVar16);
          auVar17._4_4_ = fVar94;
          auVar17._0_4_ = fVar93;
          auVar17._8_4_ = fVar105;
          auVar17._12_4_ = fVar86;
          auVar40 = maxps(auVar40,auVar17);
          auVar81._0_4_ = fVar85 + fVar76;
          auVar81._4_4_ = fVar88 + fVar90;
          auVar81._8_4_ = fVar91 + fVar82;
          auVar81._12_4_ = fVar92 + fVar84;
          auVar34 = minps(auVar34,auVar81);
          auVar40 = maxps(auVar40,auVar81);
          auVar71._0_4_ = fVar76 + fVar95;
          auVar71._4_4_ = fVar90 + fVar101;
          auVar71._8_4_ = fVar82 + fVar58;
          auVar71._12_4_ = fVar84 + fVar60;
          auVar34 = minps(auVar34,auVar71);
          auVar72 = auVar34._0_12_;
          auVar40 = maxps(auVar40,auVar71);
          auVar48 = auVar40._0_12_;
          _local_168 = auVar64;
        }
        else {
          fVar61 = (pAVar6->l).vx.field_0.m128[0];
          fVar96 = (pAVar6->l).vx.field_0.m128[1];
          fVar99 = (pAVar6->l).vx.field_0.m128[2];
          fVar102 = (pAVar6->l).vx.field_0.m128[3];
          fVar97 = (pAVar6->l).vy.field_0.m128[0];
          fVar100 = (pAVar6->l).vy.field_0.m128[1];
          fVar103 = (pAVar6->l).vy.field_0.m128[2];
          fVar47 = (pAVar6->l).vy.field_0.m128[3];
          fVar49 = (pAVar6->l).vz.field_0.m128[0];
          fVar65 = (pAVar6->l).vz.field_0.m128[1];
          fVar68 = (pAVar6->l).vz.field_0.m128[2];
          fVar69 = (pAVar6->l).vz.field_0.m128[3];
          fVar70 = (pAVar6->p).field_0.m128[0];
          fVar95 = (pAVar6->p).field_0.m128[1];
          fVar98 = (pAVar6->p).field_0.m128[2];
          fVar101 = (pAVar6->p).field_0.m128[3];
          lVar28 = *(long *)&(pIVar4->super_Geometry).field_0x58;
          auVar40 = minps(*(undefined1 (*) [16])(lVar28 + 0x10),
                          *(undefined1 (*) [16])(lVar28 + 0x30));
          auVar34 = maxps(*(undefined1 (*) [16])(lVar28 + 0x20),
                          *(undefined1 (*) [16])(lVar28 + 0x40));
          fVar60 = auVar40._0_4_;
          fVar91 = auVar40._4_4_;
          fVar57 = auVar40._8_4_;
          fVar88 = fVar57 * fVar49 + fVar70;
          fVar92 = fVar57 * fVar65 + fVar95;
          fVar93 = fVar57 * fVar68 + fVar98;
          fVar94 = fVar57 * fVar69 + fVar101;
          fVar105 = fVar91 * fVar97;
          fVar87 = fVar91 * fVar100;
          fVar89 = fVar91 * fVar103;
          fVar91 = fVar91 * fVar47;
          fVar76 = fVar105 + fVar88;
          fVar90 = fVar87 + fVar92;
          fVar82 = fVar89 + fVar93;
          fVar83 = fVar91 + fVar94;
          fVar57 = fVar60 * fVar61;
          fVar58 = fVar60 * fVar96;
          fVar59 = fVar60 * fVar99;
          fVar60 = fVar60 * fVar102;
          fVar84 = fVar57 + fVar76;
          fVar85 = fVar58 + fVar90;
          fVar86 = fVar59 + fVar82;
          fVar106 = fVar60 + fVar83;
          auVar24._4_4_ = fVar85;
          auVar24._0_4_ = fVar84;
          auVar24._8_4_ = fVar86;
          auVar24._12_4_ = fVar106;
          auVar77 = minps(_DAT_01feb9f0,auVar24);
          auVar25._4_4_ = fVar85;
          auVar25._0_4_ = fVar84;
          auVar25._8_4_ = fVar86;
          auVar25._12_4_ = fVar106;
          auVar40 = maxps(auVar36,auVar25);
          fVar84 = auVar34._0_4_;
          fVar85 = auVar34._4_4_;
          fVar86 = auVar34._8_4_;
          fVar70 = fVar86 * fVar49 + fVar70;
          fVar95 = fVar86 * fVar65 + fVar95;
          fVar98 = fVar86 * fVar68 + fVar98;
          fVar101 = fVar86 * fVar69 + fVar101;
          fVar105 = fVar105 + fVar70;
          fVar87 = fVar87 + fVar95;
          fVar89 = fVar89 + fVar98;
          fVar91 = fVar91 + fVar101;
          auVar42._0_4_ = fVar57 + fVar105;
          auVar42._4_4_ = fVar58 + fVar87;
          auVar42._8_4_ = fVar59 + fVar89;
          auVar42._12_4_ = fVar60 + fVar91;
          auVar34 = minps(auVar77,auVar42);
          auVar40 = maxps(auVar40,auVar42);
          fVar97 = fVar85 * fVar97;
          fVar100 = fVar85 * fVar100;
          fVar103 = fVar85 * fVar103;
          fVar85 = fVar85 * fVar47;
          fVar88 = fVar88 + fVar97;
          fVar92 = fVar92 + fVar100;
          fVar93 = fVar93 + fVar103;
          fVar94 = fVar94 + fVar85;
          auVar43._0_4_ = fVar57 + fVar88;
          auVar43._4_4_ = fVar58 + fVar92;
          auVar43._8_4_ = fVar59 + fVar93;
          auVar43._12_4_ = fVar60 + fVar94;
          auVar34 = minps(auVar34,auVar43);
          auVar40 = maxps(auVar40,auVar43);
          fVar97 = fVar97 + fVar70;
          fVar100 = fVar100 + fVar95;
          fVar103 = fVar103 + fVar98;
          fVar85 = fVar85 + fVar101;
          auVar52._0_4_ = fVar57 + fVar97;
          auVar52._4_4_ = fVar58 + fVar100;
          auVar52._8_4_ = fVar59 + fVar103;
          auVar52._12_4_ = fVar60 + fVar85;
          auVar34 = minps(auVar34,auVar52);
          auVar40 = maxps(auVar40,auVar52);
          fVar61 = fVar84 * fVar61;
          fVar96 = fVar84 * fVar96;
          fVar99 = fVar84 * fVar99;
          fVar84 = fVar84 * fVar102;
          auVar55._0_4_ = fVar76 + fVar61;
          auVar55._4_4_ = fVar90 + fVar96;
          auVar55._8_4_ = fVar82 + fVar99;
          auVar55._12_4_ = fVar83 + fVar84;
          auVar34 = minps(auVar34,auVar55);
          auVar40 = maxps(auVar40,auVar55);
          fVar105 = fVar105 + fVar61;
          fVar87 = fVar87 + fVar96;
          fVar89 = fVar89 + fVar99;
          fVar91 = fVar91 + fVar84;
          auVar14._4_4_ = fVar87;
          auVar14._0_4_ = fVar105;
          auVar14._8_4_ = fVar89;
          auVar14._12_4_ = fVar91;
          auVar34 = minps(auVar34,auVar14);
          auVar15._4_4_ = fVar87;
          auVar15._0_4_ = fVar105;
          auVar15._8_4_ = fVar89;
          auVar15._12_4_ = fVar91;
          auVar40 = maxps(auVar40,auVar15);
          auVar80._0_4_ = fVar88 + fVar61;
          auVar80._4_4_ = fVar92 + fVar96;
          auVar80._8_4_ = fVar93 + fVar99;
          auVar80._12_4_ = fVar94 + fVar84;
          auVar34 = minps(auVar34,auVar80);
          auVar40 = maxps(auVar40,auVar80);
          auVar63._0_4_ = fVar61 + fVar97;
          auVar63._4_4_ = fVar96 + fVar100;
          auVar63._8_4_ = fVar99 + fVar103;
          auVar63._12_4_ = fVar84 + fVar85;
          auVar34 = minps(auVar34,auVar63);
          auVar72 = auVar34._0_12_;
          auVar40 = maxps(auVar40,auVar63);
          auVar48 = auVar40._0_12_;
        }
        uVar39 = (uint)(((auVar48._0_4_ + auVar72._0_4_) - auVar32._0_4_) *
                       (float)((uint)(((1.0 - auVar41._0_4_ * fVar33) * fVar33 + fVar33) * 1013.76)
                              & -(uint)(1e-19 < auVar41._0_4_)));
        uVar45 = (uint)(((auVar48._4_4_ + auVar72._4_4_) - auVar32._4_4_) *
                       (float)((uint)(((1.0 - auVar41._4_4_ * fVar37) * fVar37 + fVar37) * 1013.76)
                              & -(uint)(1e-19 < auVar41._4_4_)));
        uVar46 = (uint)(((auVar48._8_4_ + auVar72._8_4_) - auVar32._8_4_) *
                       (float)((uint)(((1.0 - auVar41._8_4_ * fVar38) * fVar38 + fVar38) * 1013.76)
                              & -(uint)(1e-19 < auVar41._8_4_)));
        uVar39 = (uVar39 << 0x10 | uVar39) & 0x30000ff;
        uVar39 = (uVar39 << 8 | uVar39) & 0x300f00f;
        uVar45 = (uVar45 << 0x10 | uVar45) & 0x30000ff;
        uVar30 = (uVar45 << 8 | uVar45) & 0x300f00f;
        uVar45 = (uVar46 << 0x10 | uVar46) & 0x30000ff;
        uVar45 = (uVar45 << 8 | uVar45) & 0x300f00f;
        this->morton[uVar31].field_0.field_0.code =
             ((uVar45 << 4 | uVar45) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar30 << 4 | uVar30) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar39 << 4 | uVar39) & 0x30c30c3) * 5 & 0x9249249;
        uVar31 = uVar31 + 1;
        uVar29 = (ulong)current->_end;
      } while (uVar31 < uVar29);
    }
    uVar39 = current->_begin;
    if (uVar39 != (uint)uVar29) {
      pBVar1 = this->morton + uVar29;
      pBVar2 = this->morton + uVar39;
      uVar31 = (long)(uVar29 * 8 + (ulong)uVar39 * -8) >> 3;
      lVar28 = 0x3f;
      if (uVar31 != 0) {
        for (; uVar31 >> lVar28 == 0; lVar28 = lVar28 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar28 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
      return;
    }
  }
  else {
    local_58._0_8_ = 0x7f8000007f800000;
    local_58._8_8_ = 0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_140.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize(&local_d8);
    local_138._4_4_ = uVar39;
    local_138._0_4_ = uVar45;
    local_130 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_118.my_real_body = &local_128;
    local_128.reduction = BBox<embree::Vec3fa>::merge;
    local_128.func = &local_140;
    local_118.my_reduction = BBox<embree::Vec3fa>::merge;
    local_118.my_value.lower.field_0._0_8_ = local_58._0_8_;
    local_118.my_value.lower.field_0._8_8_ = local_58._8_8_;
    local_118.my_value.upper.field_0._0_8_ = local_48;
    local_118.my_value.upper.field_0._8_8_ = uStack_40;
    local_118.my_identity_element = (BBox<embree::Vec3fa> *)&local_58;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_138,&local_118,&local_189,&local_d8);
    _fStack_160 = local_118.my_value.lower.field_0._8_8_;
    local_168 = (undefined1  [8])local_118.my_value.lower.field_0._0_8_;
    _fStack_180 = local_118.my_value.upper.field_0._8_8_;
    local_188 = (undefined1  [8])local_118.my_value.upper.field_0._0_8_;
    cVar26 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar26 != '\0') {
      prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar27,"task cancelled");
      __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    auVar36._8_8_ = extraout_XMM1_Qb;
    auVar36._0_8_ = extraout_XMM1_Qa;
    local_118.my_identity_element = local_168;
    local_118.my_real_body = local_168._8_8_;
    auVar32._0_4_ = (float)local_188._0_4_ - (float)local_168._0_4_;
    auVar32._4_4_ = (float)local_188._4_4_ - (float)local_168._4_4_;
    auVar32._8_4_ = fStack_180 - fStack_160;
    auVar32._12_4_ = fStack_17c - fStack_15c;
    auVar36 = rcpps(auVar36,auVar32);
    fVar33 = auVar36._0_4_;
    fVar37 = auVar36._4_4_;
    fVar38 = auVar36._8_4_;
    fVar61 = auVar36._12_4_;
    local_118._24_4_ =
         (uint)(((1.0 - auVar32._8_4_ * fVar38) * fVar38 + fVar38) * 1013.76) &
         -(uint)(1e-19 < auVar32._8_4_);
    local_118._28_4_ =
         (uint)(((1.0 - auVar32._12_4_ * fVar61) * fVar61 + fVar61) * 1013.76) &
         -(uint)(1e-19 < auVar32._12_4_);
    local_118.my_reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
         CONCAT44((uint)(((1.0 - auVar32._4_4_ * fVar37) * fVar37 + fVar37) * 1013.76) &
                  -(uint)(1e-19 < auVar32._4_4_),
                  (uint)(((1.0 - auVar32._0_4_ * fVar33) * fVar33 + fVar33) * 1013.76) &
                  -(uint)(1e-19 < auVar32._0_4_));
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    _fStack_180 = 0;
    local_188._0_4_ = current->_begin;
    local_188._4_4_ = current->_end;
    local_138 = this;
    local_130 = &local_118;
    tbb::detail::r1::initialize(&local_d8);
    local_58._0_8_ = CONCAT44(local_188._0_4_,local_188._4_4_);
    local_58._8_8_ = 0x400;
    local_128.reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&local_138;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_58.field_1,(anon_class_8_1_898bcfc2 *)&local_128,
          &local_189,&local_d8);
    cVar26 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar26 != '\0') {
      prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar27,"task cancelled");
      __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }